

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000190de0 = 0x2d2d2d2d2d2d2d;
    uRam0000000000190de7._0_1_ = '-';
    uRam0000000000190de7._1_1_ = '-';
    uRam0000000000190de7._2_1_ = '-';
    uRam0000000000190de7._3_1_ = '-';
    uRam0000000000190de7._4_1_ = '-';
    uRam0000000000190de7._5_1_ = '-';
    uRam0000000000190de7._6_1_ = '-';
    uRam0000000000190de7._7_1_ = '-';
    DAT_00190dd0 = '-';
    DAT_00190dd0_1._0_1_ = '-';
    DAT_00190dd0_1._1_1_ = '-';
    DAT_00190dd0_1._2_1_ = '-';
    DAT_00190dd0_1._3_1_ = '-';
    DAT_00190dd0_1._4_1_ = '-';
    DAT_00190dd0_1._5_1_ = '-';
    DAT_00190dd0_1._6_1_ = '-';
    uRam0000000000190dd8 = 0x2d2d2d2d2d2d2d;
    DAT_00190ddf = 0x2d;
    DAT_00190dc0 = '-';
    DAT_00190dc0_1._0_1_ = '-';
    DAT_00190dc0_1._1_1_ = '-';
    DAT_00190dc0_1._2_1_ = '-';
    DAT_00190dc0_1._3_1_ = '-';
    DAT_00190dc0_1._4_1_ = '-';
    DAT_00190dc0_1._5_1_ = '-';
    DAT_00190dc0_1._6_1_ = '-';
    uRam0000000000190dc8._0_1_ = '-';
    uRam0000000000190dc8._1_1_ = '-';
    uRam0000000000190dc8._2_1_ = '-';
    uRam0000000000190dc8._3_1_ = '-';
    uRam0000000000190dc8._4_1_ = '-';
    uRam0000000000190dc8._5_1_ = '-';
    uRam0000000000190dc8._6_1_ = '-';
    uRam0000000000190dc8._7_1_ = '-';
    DAT_00190db0 = '-';
    DAT_00190db0_1._0_1_ = '-';
    DAT_00190db0_1._1_1_ = '-';
    DAT_00190db0_1._2_1_ = '-';
    DAT_00190db0_1._3_1_ = '-';
    DAT_00190db0_1._4_1_ = '-';
    DAT_00190db0_1._5_1_ = '-';
    DAT_00190db0_1._6_1_ = '-';
    uRam0000000000190db8._0_1_ = '-';
    uRam0000000000190db8._1_1_ = '-';
    uRam0000000000190db8._2_1_ = '-';
    uRam0000000000190db8._3_1_ = '-';
    uRam0000000000190db8._4_1_ = '-';
    uRam0000000000190db8._5_1_ = '-';
    uRam0000000000190db8._6_1_ = '-';
    uRam0000000000190db8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000190da8._0_1_ = '-';
    uRam0000000000190da8._1_1_ = '-';
    uRam0000000000190da8._2_1_ = '-';
    uRam0000000000190da8._3_1_ = '-';
    uRam0000000000190da8._4_1_ = '-';
    uRam0000000000190da8._5_1_ = '-';
    uRam0000000000190da8._6_1_ = '-';
    uRam0000000000190da8._7_1_ = '-';
    DAT_00190def = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}